

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

void mk_server_loop_balancer(mk_server *server)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  mk_list *list;
  mk_event_loop *loop;
  int *piVar4;
  char *pcVar5;
  mk_event_loop *local_d0;
  mk_event_ctx *__ctx;
  int __i;
  mk_list *__mptr;
  mk_event management_event;
  mk_sched_worker *sched;
  mk_event_loop *evl;
  mk_event *event;
  mk_server_listen *listener;
  mk_list *listeners;
  mk_list *head;
  long lStack_20;
  int operation_flag;
  uint64_t val;
  size_t bytes;
  mk_server *server_local;
  
  bytes = (size_t)server;
  list = mk_server_listen_init(server);
  if (list == (mk_list *)0x0) {
    mk_print(0x1001,"Failed to initialize listen sockets.");
  }
  else {
    loop = mk_event_loop_create(0x100);
    if (loop == (mk_event_loop *)0x0) {
      mk_print(0x1001,"Could not initialize event loop");
      exit(1);
    }
    for (listeners = list->next; listeners != list; listeners = listeners->next) {
      mk_event_add(loop,*(int *)&listeners[-2].prev,1,1,&listeners[-7].next);
    }
    memset(&__mptr,0,0x48);
    mk_event_add(loop,*(int *)(bytes + 0x188),0,1,&__mptr);
    bVar3 = true;
LAB_001167bf:
    if (bVar3) {
      mk_event_wait(loop);
      pvVar2 = loop->data;
      if (0 < loop->n_events) {
        evl = *(mk_event_loop **)(*(long *)((long)pvVar2 + 8) + 4);
      }
      __ctx._4_4_ = 0;
      while (__ctx._4_4_ < loop->n_events) {
        if (((ulong)evl->events & 1) == 0) {
          if (((ulong)evl->events & 0x2018) != 0) {
            uVar1 = evl->size;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            mk_print(0x1001,"[server] Error on socket %d: %s",(ulong)uVar1,pcVar5);
          }
        }
        else if (*(int *)(bytes + 0x188) == evl->size) {
          val = read(evl->size,&stack0xffffffffffffffe0,8);
          if (val == 0) {
            return;
          }
          if (lStack_20 == 0xdddddddd) {
            bVar3 = false;
            break;
          }
        }
        else {
          management_event._64_8_ = mk_sched_next_target((mk_server *)bytes);
          if ((mk_sched_worker *)management_event._64_8_ == (mk_sched_worker *)0x0) {
            mk_print(0x1002,"[server] Over capacity.");
          }
          else {
            mk_server_listen_handler
                      ((mk_sched_worker *)management_event._64_8_,evl,(mk_server *)bytes);
            mk_server_lib_notify_event_loop_break((mk_sched_worker *)management_event._64_8_);
          }
        }
        __ctx._4_4_ = __ctx._4_4_ + 1;
        if (__ctx._4_4_ < loop->n_events) {
          local_d0 = *(mk_event_loop **)(*(long *)((long)pvVar2 + 8) + (long)__ctx._4_4_ * 0xc + 4);
        }
        else {
          local_d0 = (mk_event_loop *)0x0;
        }
        evl = local_d0;
      }
      goto LAB_001167bf;
    }
    mk_event_loop_destroy(loop);
    mk_server_listen_exit(list);
  }
  return;
}

Assistant:

void mk_server_loop_balancer(struct mk_server *server)
{
    size_t bytes;
    uint64_t val;
    int operation_flag;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_server_listen *listener;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_sched_worker *sched;
    struct mk_event management_event;

    /* Init the listeners */
    listeners = mk_server_listen_init(server);
    if (!listeners) {
        mk_err("Failed to initialize listen sockets.");
        return;
    }

    /* Create an event loop context */
    evl = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!evl) {
        mk_err("Could not initialize event loop");
        exit(EXIT_FAILURE);
    }

    /* Register the listeners */
    mk_list_foreach(head, listeners) {
        listener = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_add(evl, listener->server_fd,
                     MK_EVENT_LISTENER, MK_EVENT_READ,
                     listener);
    }

    memset(&management_event, 0, sizeof(struct mk_event));

    mk_event_add(evl,
                 server->lib_ch_manager[0],
                 MK_EVENT_NOTIFICATION,
                 MK_EVENT_READ,
                 &management_event);

    operation_flag = MK_TRUE;
    while (operation_flag) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            if (event->mask & MK_EVENT_READ) {
                /* This signal is sent by mk_stop and both this and
                 * mk_lib_worker are expecting it.
                 */
                if (server->lib_ch_manager[0] == event->fd) {
#ifdef _WIN32
        bytes = recv(event->fd, &val, sizeof(uint64_t), MSG_WAITALL);
#else
        bytes = read(event->fd, &val, sizeof(uint64_t));
#endif

                    if (bytes <= 0) {
                        return;
                    }

                    if (val == MK_SERVER_SIGNAL_STOP) {
                        operation_flag = MK_FALSE;

                        break;
                    }

                    continue;
                }

                /*
                 * Accept connection: determinate which thread may work on this
                 * new connection.
                 */
                sched = mk_sched_next_target(server);
                if (sched != NULL) {
                    mk_server_listen_handler(sched, event, server);

                    mk_server_lib_notify_event_loop_break(sched);

#ifdef MK_HAVE_TRACE
                    int i;
                    struct mk_sched_ctx *ctx = server->sched_ctx;

                    for (i = 0; i < server->workers; i++) {
                        MK_TRACE("Worker Status");
                        MK_TRACE(" WID %i / conx = %llu",
                                 ctx->workers[i].idx,
                                 ctx->workers[i].accepted_connections -
                                 ctx->workers[i].closed_connections);
                    }
#endif
                }
                else {
                    mk_warn("[server] Over capacity.");
                }
            }
            else if (event->mask & MK_EVENT_CLOSE) {
                mk_err("[server] Error on socket %d: %s",
                       event->fd, strerror(errno));
            }
        }
    }
    mk_event_loop_destroy(evl);
    mk_server_listen_exit(listeners);
}